

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void __thiscall boost::deflate::error_test::check(error_test *this,char *name,error ev)

{
  runner *prVar1;
  bool cond;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_category *peVar4;
  error_category *peVar5;
  error_code eVar6;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  error_code ec;
  
  ec = make_error_code(ev);
  peVar4 = ec.cat_;
  uVar3 = ec._0_8_;
  eVar6 = make_error_code(0);
  prVar1 = test_suite::detail::current()::p;
  peVar5 = eVar6.cat_;
  iVar2 = (**peVar4->_vptr_error_category)(peVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(char *)CONCAT44(extraout_var,iVar2),&local_61);
  cond = std::operator==(&local_60,name);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,cond,"std::string{ec.category().name()} == name",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1b,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  prVar1 = test_suite::detail::current()::p;
  (*peVar4->_vptr_error_category[4])(&local_60,peVar4,uVar3 & 0xffffffff);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,local_60._M_string_length != 0,"! ec.message().empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1c,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  peVar4 = ec.cat_;
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,ec.cat_ == peVar5,
             "std::addressof(ec.category()) == std::addressof(cat)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1e,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  prVar1 = test_suite::detail::current()::p;
  iVar2 = (*peVar4->_vptr_error_category[1])(peVar4,(ulong)ev);
  local_60._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*peVar5->_vptr_error_category[2])(peVar5,(ulong)ev,&local_60);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,SUB41(iVar2,0),
             "cat.equivalent( static_cast<std::underlying_type<error>::type>(ev), ec.category().default_error_condition( static_cast<std::underlying_type<error>::type>(ev)))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x22,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  prVar1 = test_suite::detail::current()::p;
  iVar2 = (*peVar5->_vptr_error_category[3])(peVar5,&ec,(ulong)ev);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,SUB41(iVar2,0),
             "cat.equivalent(ec, static_cast<std::underlying_type<error>::type>(ev))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x24,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  return;
}

Assistant:

void check(char const* name, error ev)
    {
        auto const ec = make_error_code(ev);
        auto const& cat = make_error_code(
            static_cast<deflate::error>(0)).category();
        BOOST_TEST(std::string{ec.category().name()} == name);
        BOOST_TEST(! ec.message().empty());
        BOOST_TEST(
            std::addressof(ec.category()) == std::addressof(cat));
        BOOST_TEST(cat.equivalent(
            static_cast<std::underlying_type<error>::type>(ev),
                ec.category().default_error_condition(
                    static_cast<std::underlying_type<error>::type>(ev))));
        BOOST_TEST(cat.equivalent(ec,
            static_cast<std::underlying_type<error>::type>(ev)));
    }